

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_shr8_ins_i64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,int64_t shift)

{
  ulong arg2;
  TCGv_i64 ret;
  TCGv_i64 t;
  uint64_t mask;
  int64_t shift_local;
  TCGv_i64 a_local;
  TCGv_i64 d_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  arg2 = (ulong)(0xff >> ((byte)shift & 0x1f) & 0xff) * 0x101010101010101;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_shri_i64_aarch64(tcg_ctx,ret,a,shift);
  tcg_gen_andi_i64_aarch64(tcg_ctx,ret,ret,arg2);
  tcg_gen_andi_i64_aarch64(tcg_ctx,d,d,arg2 ^ 0xffffffffffffffff);
  tcg_gen_or_i64_aarch64(tcg_ctx,d,d,ret);
  tcg_temp_free_i64(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_shr8_ins_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, int64_t shift)
{
    uint64_t mask = dup_const(MO_8, 0xff >> shift);
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_shri_i64(tcg_ctx, t, a, shift);
    tcg_gen_andi_i64(tcg_ctx, t, t, mask);
    tcg_gen_andi_i64(tcg_ctx, d, d, ~mask);
    tcg_gen_or_i64(tcg_ctx, d, d, t);
    tcg_temp_free_i64(tcg_ctx, t);
}